

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

uint32 __thiscall Bstrlib::String::getUnicodeChar(String *this,int pos)

{
  uint32 uVar1;
  uchar *array;
  uchar *local_18;
  
  local_18 = (this->super_tagbstring).data;
  if (pos != 0) {
    do {
      if (*local_18 == '\0') break;
      getUnicode(&local_18);
      pos = pos + -1;
    } while (pos != 0);
  }
  uVar1 = getUnicode(&local_18);
  return uVar1;
}

Assistant:

uint32 String::getUnicodeChar(int pos) const
    {
        // 1. Iterate to the given position
        const unsigned char * array = data;
        while (pos && *array)
        {
            (void)getUnicode(array);
            pos--;
        }
        return getUnicode(array);
    }